

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint _c;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int kj;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int k;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  void *pvVar27;
  void *pvVar28;
  int iVar29;
  long lVar30;
  void *pvVar31;
  float fVar32;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_160;
  void *local_150;
  void *local_140;
  ulong local_138;
  void *local_130;
  ulong local_128;
  void *local_108;
  allocator_type local_f1;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  Mat local_b8;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar9 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar16 = (ulong)_c;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    local_e0 = uVar16;
    if (this->adaptive_pooling == 0) {
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      make_padding(this,bottom_blob,&local_b8,opt);
      iVar3 = local_b8.h;
      iVar2 = local_b8.w;
      iVar20 = -100;
      if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
        iVar10 = (local_b8.w - this->kernel_w) / this->stride_w;
        uVar16 = (long)(local_b8.h - this->kernel_h) / (long)this->stride_h;
        local_e8 = uVar16 & 0xffffffff;
        uVar19 = iVar10 + 1;
        uVar9 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar9;
        Mat::create(top_blob,uVar19,uVar9,_c,sVar4,opt->blob_allocator);
        iVar20 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar23 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar23,&local_f1);
          if (0 < this->kernel_h) {
            iVar20 = this->kernel_w;
            iVar13 = 0;
            iVar11 = 0;
            iVar22 = 0;
            do {
              if (0 < this->kernel_w) {
                lVar15 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar22 + lVar15] = iVar11 + (int)lVar15;
                  lVar15 = lVar15 + 1;
                  iVar24 = (int)lVar15;
                } while (iVar24 < this->kernel_w);
                iVar22 = iVar22 + iVar24;
                iVar11 = iVar11 + iVar24;
              }
              iVar11 = iVar11 + (iVar2 - iVar20);
              iVar13 = iVar13 + 1;
            } while (iVar13 < this->kernel_h);
          }
          iVar20 = (int)uVar23;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar20 = 0;
              iVar13 = 0;
              if (this->pad_mode == 0) {
                iVar20 = (bottom_blob->w - local_b8.w) + this->pad_left + this->pad_right;
                iVar13 = (bottom_blob->h - local_b8.h) + this->pad_top + this->pad_bottom;
              }
              if (0 < (int)_c) {
                local_68 = local_b8.data;
                local_58 = top_blob->data;
                local_60 = top_blob->cstep * top_blob->elemsize;
                local_c8 = (long)this->stride_h;
                local_f0 = (long)(int)uVar19;
                local_d8 = (ulong)uVar19;
                local_50 = local_b8.cstep *
                           CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                lVar15 = (long)local_b8.w *
                         CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                local_c0 = lVar15 * local_c8;
                local_d0 = 0;
                do {
                  if (-1 < (int)local_e8) {
                    local_140 = (void *)(local_60 * local_d0 + (long)local_58);
                    iVar11 = this->stride_w;
                    uVar9 = this->kernel_h;
                    local_130 = local_68;
                    local_138 = 0;
                    do {
                      if (-1 < iVar10) {
                        iVar22 = this->pad_top;
                        lVar30 = 0;
                        uVar23 = 0;
                        pvVar12 = local_130;
                        do {
                          fVar32 = NAN;
                          if (0 < (int)uVar9) {
                            lVar17 = (long)((iVar13 + iVar3) - this->pad_bottom);
                            fVar32 = 0.0;
                            uVar25 = 0;
                            iVar24 = 0;
                            pvVar31 = pvVar12;
                            do {
                              lVar18 = uVar25 + local_138 * local_c8;
                              iVar21 = 0x49;
                              if (iVar22 <= lVar18) {
                                iVar21 = 0;
                                if (lVar17 <= lVar18) {
                                  iVar21 = 0x47;
                                }
                                if (lVar18 < lVar17 && 0 < this->kernel_w) {
                                  uVar14 = 0;
                                  do {
                                    iVar29 = 0x4c;
                                    if (((long)this->pad_left <= (long)(lVar30 + uVar14)) &&
                                       (iVar29 = 0x4a,
                                       (long)(lVar30 + uVar14) <
                                       (long)((iVar20 + iVar2) - this->pad_right))) {
                                      fVar32 = fVar32 + *(float *)((long)pvVar31 + uVar14 * 4);
                                      iVar24 = iVar24 + 1;
                                      iVar29 = 0;
                                    }
                                    iVar21 = 0;
                                  } while (((iVar29 == 0x4c) || (iVar29 == 0)) &&
                                          (uVar14 = uVar14 + 1, (uint)this->kernel_w != uVar14));
                                }
                              }
                              if ((iVar21 != 0x49) && (iVar21 != 0)) break;
                              uVar25 = uVar25 + 1;
                              pvVar31 = (void *)((long)pvVar31 + lVar15);
                            } while (uVar25 != uVar9);
                            fVar32 = fVar32 / (float)iVar24;
                          }
                          *(float *)((long)local_140 + uVar23 * 4) = fVar32;
                          uVar23 = uVar23 + 1;
                          pvVar12 = (void *)((long)pvVar12 + (long)iVar11 * 4);
                          lVar30 = lVar30 + iVar11;
                        } while (uVar23 != local_d8);
                      }
                      local_140 = (void *)((long)local_140 + local_f0 * 4);
                      local_138 = local_138 + 1;
                      local_130 = (void *)((long)local_130 + local_c0);
                    } while (local_138 != uVar16);
                  }
                  local_d0 = local_d0 + 1;
                  local_68 = (void *)((long)local_68 + local_50);
                } while (local_d0 != local_e0);
              }
            }
            else if (0 < (int)_c) {
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              pvVar12 = top_blob->data;
              local_160 = 0;
              do {
                if (-1 < (int)local_e8) {
                  pvVar31 = (void *)(sVar4 * sVar5 * local_160 + (long)pvVar12);
                  iVar2 = this->stride_h;
                  iVar3 = this->stride_w;
                  uVar25 = 0;
                  do {
                    if (-1 < iVar10) {
                      uVar14 = 0;
                      do {
                        if (iVar20 < 1) {
                          fVar32 = 0.0;
                        }
                        else {
                          fVar32 = 0.0;
                          uVar26 = 0;
                          do {
                            fVar32 = fVar32 + *(float *)((long)local_b8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                                  4 + uVar14 * (long)iVar3 * 4 +
                                                      uVar25 * (long)iVar2 *
                                                               (long)local_b8.w *
                                                               CONCAT44(local_b8.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_b8.elemsize) +
                                                      local_b8.cstep *
                                                      CONCAT44(local_b8.elemsize._4_4_,
                                                               (undefined4)local_b8.elemsize) *
                                                      local_160);
                            uVar26 = uVar26 + 1;
                          } while ((uVar23 & 0xffffffff) != uVar26);
                        }
                        *(float *)((long)pvVar31 + uVar14 * 4) = fVar32 * (1.0 / (float)iVar20);
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar19);
                    }
                    pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar19 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar16);
                }
                local_160 = local_160 + 1;
              } while (local_160 != local_e0);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)_c)) {
            pvVar12 = top_blob->data;
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            local_160 = 0;
            do {
              if (-1 < (int)local_e8) {
                pvVar31 = (void *)(sVar4 * sVar5 * local_160 + (long)pvVar12);
                iVar2 = this->stride_h;
                iVar3 = this->stride_w;
                uVar25 = 0;
                do {
                  if (-1 < iVar10) {
                    lVar15 = uVar25 * (long)iVar2 *
                                      (long)local_b8.w *
                                      CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize
                                              ) +
                             local_b8.cstep *
                             CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                             local_160;
                    uVar14 = 0;
                    do {
                      lVar30 = uVar14 * (long)iVar3;
                      fVar32 = *(float *)((long)local_b8.data + lVar30 * 4 + lVar15);
                      if (0 < iVar20) {
                        uVar26 = 0;
                        do {
                          fVar1 = *(float *)((long)local_b8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar26] *
                                            4 + lVar30 * 4 + lVar15);
                          if (fVar32 <= fVar1) {
                            fVar32 = fVar1;
                          }
                          uVar26 = uVar26 + 1;
                        } while ((uVar23 & 0xffffffff) != uVar26);
                      }
                      *(float *)((long)pvVar31 + uVar14 * 4) = fVar32;
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != uVar19);
                  }
                  pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar19 * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar16);
              }
              local_160 = local_160 + 1;
            } while (local_160 != local_e0);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar20 = 0;
        }
      }
      piVar6 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uVar19 = uVar9;
      if (this->out_w != 0xffffff17) {
        uVar19 = this->out_w;
      }
      iVar3 = this->out_h;
      if (this->out_h == -0xe9) {
        iVar3 = iVar2;
      }
      if (iVar3 == iVar2 && uVar19 == uVar9) {
        iVar20 = 0;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar20 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar2 = bottom_blob->w;
          iVar3 = bottom_blob->h;
          iVar10 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar2;
          top_blob->h = iVar3;
          top_blob->d = iVar10;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
      }
      else {
        Mat::create(top_blob,uVar19,iVar3,_c,sVar4,opt->blob_allocator);
        iVar20 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar20 = 0;
          if (this->pooling_type == 0) {
            if (0 < (int)_c) {
              lVar30 = bottom_blob->cstep * bottom_blob->elemsize;
              pvVar12 = bottom_blob->data;
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              pvVar31 = top_blob->data;
              lVar15 = (long)(int)uVar9 * 4;
              local_138 = 0;
              local_130 = pvVar12;
              do {
                if (0 < iVar3) {
                  pvVar27 = (void *)(sVar4 * sVar5 * local_138 + (long)pvVar31);
                  iVar20 = 0;
                  do {
                    iVar10 = iVar20 + 1;
                    iVar13 = (iVar10 * iVar2 + iVar3 + -1) / iVar3;
                    if (0 < (int)uVar19) {
                      iVar20 = (iVar20 * iVar2) / iVar3;
                      uVar16 = 0;
                      do {
                        iVar11 = (int)(uVar9 * (int)uVar16) / (int)uVar19;
                        uVar23 = uVar16 + 1;
                        iVar22 = (int)((int)uVar23 * uVar9 + (uVar19 - 1)) / (int)uVar19;
                        fVar32 = *(float *)((long)pvVar12 +
                                           (long)(int)(iVar11 + iVar20 * uVar9) * 4 +
                                           lVar30 * local_138);
                        if (iVar20 < iVar13) {
                          lVar17 = (long)iVar20;
                          pvVar28 = (void *)(lVar15 * iVar20 + (long)local_130);
                          do {
                            lVar18 = (long)iVar11;
                            if (iVar11 < iVar22) {
                              do {
                                fVar1 = *(float *)((long)pvVar28 + lVar18 * 4);
                                if (fVar32 <= fVar1) {
                                  fVar32 = fVar1;
                                }
                                lVar18 = lVar18 + 1;
                              } while (iVar22 != lVar18);
                            }
                            lVar17 = lVar17 + 1;
                            pvVar28 = (void *)((long)pvVar28 + lVar15);
                          } while (lVar17 != iVar13);
                        }
                        *(float *)((long)pvVar27 + uVar16 * 4) = fVar32;
                        uVar16 = uVar23;
                      } while (uVar23 != uVar19);
                    }
                    pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar19 * 4);
                    iVar20 = iVar10;
                  } while (iVar10 != iVar3);
                }
                local_138 = local_138 + 1;
                local_130 = (void *)((long)local_130 + lVar30);
                iVar20 = 0;
              } while (local_138 != local_e0);
            }
          }
          else if ((this->pooling_type == 1) && (0 < (int)_c)) {
            local_108 = bottom_blob->data;
            sVar4 = bottom_blob->cstep;
            pvVar12 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            sVar8 = bottom_blob->elemsize;
            lVar15 = (long)(int)uVar9 * 4;
            local_128 = 0;
            do {
              if (0 < iVar3) {
                local_150 = (void *)(sVar5 * sVar7 * local_128 + (long)pvVar12);
                iVar20 = 0;
                do {
                  iVar10 = iVar20 + 1;
                  iVar13 = (iVar10 * iVar2 + iVar3 + -1) / iVar3;
                  if (0 < (int)uVar19) {
                    iVar20 = (iVar20 * iVar2) / iVar3;
                    uVar16 = 0;
                    do {
                      iVar22 = (int)((int)uVar16 * uVar9) / (int)uVar19;
                      uVar23 = uVar16 + 1;
                      iVar11 = (int)((int)uVar23 * uVar9 + (uVar19 - 1)) / (int)uVar19;
                      fVar32 = 0.0;
                      if (iVar20 < iVar13) {
                        lVar30 = (long)iVar20;
                        pvVar31 = (void *)(lVar15 * iVar20 + (long)local_108);
                        do {
                          lVar17 = (long)iVar22;
                          if (iVar22 < iVar11) {
                            do {
                              fVar32 = fVar32 + *(float *)((long)pvVar31 + lVar17 * 4);
                              lVar17 = lVar17 + 1;
                            } while (iVar11 != lVar17);
                          }
                          lVar30 = lVar30 + 1;
                          pvVar31 = (void *)((long)pvVar31 + lVar15);
                        } while (lVar30 != iVar13);
                      }
                      *(float *)((long)local_150 + uVar16 * 4) =
                           fVar32 / ((float)(iVar11 - iVar22) * (float)(iVar13 - iVar20));
                      uVar16 = uVar23;
                    } while (uVar23 != uVar19);
                  }
                  local_150 = (void *)((long)local_150 + (long)(int)uVar19 * 4);
                  iVar20 = iVar10;
                } while (iVar10 != iVar3);
              }
              local_128 = local_128 + 1;
              local_108 = (void *)((long)local_108 + sVar4 * sVar8);
              iVar20 = 0;
            } while (local_128 != local_e0);
          }
        }
      }
    }
  }
  else {
    Mat::create(top_blob,_c,sVar4,opt->blob_allocator);
    iVar20 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar9 = iVar2 * uVar9;
      if (this->pooling_type == 0) {
        if ((int)_c < 1) {
          return 0;
        }
        pvVar12 = bottom_blob->data;
        lVar15 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar31 = top_blob->data;
        uVar23 = 0;
        pvVar27 = pvVar12;
        do {
          fVar32 = *(float *)((long)pvVar12 + lVar15 * uVar23);
          if (0 < (int)uVar9) {
            uVar25 = 0;
            do {
              fVar1 = *(float *)((long)pvVar27 + uVar25 * 4);
              if (fVar32 <= fVar1) {
                fVar32 = fVar1;
              }
              uVar25 = uVar25 + 1;
            } while (uVar9 != uVar25);
          }
          *(float *)((long)pvVar31 + uVar23 * 4) = fVar32;
          uVar23 = uVar23 + 1;
          pvVar27 = (void *)((long)pvVar27 + lVar15);
        } while (uVar23 != uVar16);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)_c < 1) {
          return 0;
        }
        pvVar12 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        pvVar31 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        uVar23 = 0;
        do {
          if ((int)uVar9 < 1) {
            fVar32 = 0.0;
          }
          else {
            fVar32 = 0.0;
            uVar25 = 0;
            do {
              fVar32 = fVar32 + *(float *)((long)pvVar12 + uVar25 * 4);
              uVar25 = uVar25 + 1;
            } while (uVar9 != uVar25);
          }
          *(float *)((long)pvVar31 + uVar23 * 4) = fVar32 * (1.0 / (float)(int)uVar9);
          uVar23 = uVar23 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
        } while (uVar23 != uVar16);
      }
      iVar20 = 0;
    }
  }
  return iVar20;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;

        if (_out_w == w && _out_h == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += _out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += _out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}